

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

bool __thiscall spvtools::opt::LoopPeeling::IsConditionCheckSideEffectFree(LoopPeeling *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t entry;
  CFG *this_00;
  BasicBlock *pBVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  const_reference pvVar4;
  reference puVar5;
  anon_class_8_1_8991fb9c local_c0;
  function<bool_(spvtools::opt::Instruction_*)> local_b8;
  BasicBlock *local_98;
  BasicBlock *bb;
  _Node_iterator_base<unsigned_int,_false> _Stack_88;
  uint32_t bb_id;
  iterator __end3;
  iterator __begin3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3;
  undefined1 local_60 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  blocks_in_path;
  uint32_t condition_block_id;
  CFG *cfg;
  LoopPeeling *this_local;
  
  this_00 = IRContext::cfg(this->context_);
  if ((this->do_while_form_ & 1U) == 0) {
    pBVar3 = Loop::GetMergeBlock(this->loop_);
    uVar2 = BasicBlock::id(pBVar3);
    this_01 = CFG::preds(this_00,uVar2);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_01,0);
    blocks_in_path._M_h._M_single_bucket._4_4_ = *pvVar4;
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_60);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_60,(value_type *)((long)&blocks_in_path._M_h._M_single_bucket + 4));
    uVar2 = blocks_in_path._M_h._M_single_bucket._4_4_;
    pBVar3 = Loop::GetHeaderBlock(this->loop_);
    entry = BasicBlock::id(pBVar3);
    anon_unknown_28::GetBlocksInPath
              (uVar2,entry,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_60,this_00);
    __end3 = std::
             unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_60);
    _Stack_88._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_60);
    while (bVar1 = std::__detail::operator!=
                             (&__end3.super__Node_iterator_base<unsigned_int,_false>,
                              &stack0xffffffffffffff78), bVar1) {
      puVar5 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end3);
      bb._4_4_ = *puVar5;
      pBVar3 = CFG::block(this_00,bb._4_4_);
      local_c0.this = this;
      local_98 = pBVar3;
      std::function<bool(spvtools::opt::Instruction*)>::
      function<spvtools::opt::LoopPeeling::IsConditionCheckSideEffectFree()const::__0,void>
                ((function<bool(spvtools::opt::Instruction*)> *)&local_b8,&local_c0);
      bVar1 = BasicBlock::WhileEachInst(pBVar3,&local_b8,false);
      std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_b8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        this_local._7_1_ = 0;
        bVar1 = true;
        goto LAB_00a468a2;
      }
      std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end3);
    }
    bVar1 = false;
LAB_00a468a2:
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)local_60);
    if (bVar1) goto LAB_00a468bf;
  }
  this_local._7_1_ = 1;
LAB_00a468bf:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool LoopPeeling::IsConditionCheckSideEffectFree() const {
  CFG& cfg = *context_->cfg();

  // The "do-while" form does not cause issues, the algorithm takes into account
  // the first iteration.
  if (!do_while_form_) {
    uint32_t condition_block_id = cfg.preds(loop_->GetMergeBlock()->id())[0];

    std::unordered_set<uint32_t> blocks_in_path;

    blocks_in_path.insert(condition_block_id);
    GetBlocksInPath(condition_block_id, loop_->GetHeaderBlock()->id(),
                    &blocks_in_path, cfg);

    for (uint32_t bb_id : blocks_in_path) {
      BasicBlock* bb = cfg.block(bb_id);
      if (!bb->WhileEachInst([this](Instruction* insn) {
            if (insn->IsBranch()) return true;
            switch (insn->opcode()) {
              case spv::Op::OpLabel:
              case spv::Op::OpSelectionMerge:
              case spv::Op::OpLoopMerge:
                return true;
              default:
                break;
            }
            return context_->IsCombinatorInstruction(insn);
          })) {
        return false;
      }
    }
  }

  return true;
}